

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_compressionParameters ZVar1;
  ZSTD_CDict *pZVar2;
  ZSTD_CCtx_params local_f8;
  
  ZVar1 = cParams;
  memset(&local_f8,0,0xd0);
  local_f8.fParams.contentSizeFlag = 1;
  local_f8.cParams.windowLog = cParams.windowLog;
  local_f8.cParams.chainLog = cParams.chainLog;
  local_f8.cParams.hashLog = ZVar1.hashLog;
  local_f8.cParams.searchLog = ZVar1.searchLog;
  local_f8.cParams.minMatch = ZVar1.minMatch;
  local_f8.cParams.targetLength = cParams.targetLength;
  local_f8.cParams.strategy = cParams.strategy;
  local_f8.customMem.customAlloc = customMem.customAlloc;
  local_f8.customMem.customFree = customMem.customFree;
  local_f8.customMem.opaque = customMem.opaque;
  pZVar2 = ZSTD_createCDict_advanced2
                     (dictBuffer,dictSize,dictLoadMethod,dictContentType,&local_f8,customMem);
  return pZVar2;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams,
                                      ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_memset(&cctxParams, 0, sizeof(cctxParams));
    ZSTD_CCtxParams_init(&cctxParams, 0);
    cctxParams.cParams = cParams;
    cctxParams.customMem = customMem;
    return ZSTD_createCDict_advanced2(
        dictBuffer, dictSize,
        dictLoadMethod, dictContentType,
        &cctxParams, customMem);
}